

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgIndexManipulator.cpp
# Opt level: O2

vector<int,_std::allocator<int>_> *
TasGrid::MultiIndexManipulations::computeTensorWeights
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,MultiIndexSet *mset)

{
  int *piVar1;
  int iVar2;
  pointer piVar3;
  pointer piVar4;
  pointer piVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  vector<int,_std::allocator<int>_> *weights;
  ulong uVar9;
  uint uVar10;
  long lVar11;
  int new_stride;
  long lVar12;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  map;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  lines1d;
  Data2D<int> dag_down;
  allocator_type local_a9;
  pointer local_a8;
  value_type_conflict3 local_9c;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_98;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_78;
  Data2D<int> local_58;
  
  iVar2 = mset->cache_num_indexes;
  new_stride = (int)mset->num_dimensions;
  if (new_stride == 1) {
    local_58.stride._0_4_ = 0;
    ::std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)__return_storage_ptr__,(long)iVar2,
               (value_type_conflict3 *)&local_58,(allocator_type *)&local_98);
    (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
    super__Vector_impl_data._M_finish[-1] = 1;
  }
  else {
    local_98.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_98.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_98.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_78.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_78.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_78.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    resortIndexes(mset,&local_98,&local_78);
    Data2D<int>::Data2D<int,int>(&local_58,new_stride,iVar2);
    local_9c = 0;
    ::std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)__return_storage_ptr__,(long)iVar2,&local_9c,
               &local_a9);
    piVar3 = local_78.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[new_stride + -1].
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
    local_a8 = local_78.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    uVar6 = (int)((ulong)((long)local_78.
                                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[new_stride + -1].
                                super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_finish - (long)piVar3) >> 2) - 1;
    piVar4 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar9 = 0;
    uVar7 = (ulong)uVar6;
    if ((int)uVar6 < 1) {
      uVar7 = uVar9;
    }
    for (; uVar7 * 4 != uVar9; uVar9 = uVar9 + 4) {
      piVar4[(long)*(int *)((long)piVar3 + uVar9 + 4) + -1] = 1;
    }
    for (uVar6 = new_stride - 2; -1 < (int)uVar6; uVar6 = uVar6 - 1) {
      piVar3 = local_78.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar6].
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start;
      uVar10 = (int)((ulong)((long)local_78.
                                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start[uVar6].
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_finish - (long)piVar3) >> 2) - 1;
      if ((int)uVar10 < 1) {
        uVar10 = 0;
      }
      uVar7 = 0;
      while (uVar9 = uVar7, uVar9 != uVar10) {
        piVar4 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        lVar12 = (long)(piVar3[uVar9 + 1] + -2);
        lVar8 = lVar12 + 1;
        for (; uVar7 = uVar9 + 1, piVar3[uVar9] <= lVar12; lVar12 = lVar12 + -1) {
          piVar5 = local_98.
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar6].
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start;
          iVar2 = piVar5[lVar12];
          for (lVar11 = lVar8; lVar11 < piVar3[uVar9 + 1]; lVar11 = lVar11 + 1) {
            piVar1 = piVar4 + iVar2;
            *piVar1 = *piVar1 - piVar4[piVar5[lVar11]];
          }
          lVar8 = lVar8 + -1;
        }
      }
    }
    ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&local_58.vec.super__Vector_base<int,_std::allocator<int>_>);
    ::std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               *)&local_78);
    ::std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               *)&local_98);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<int> computeTensorWeights(MultiIndexSet const &mset){
    int num_dimensions = mset.getNumDimensions();
    int num_tensors = mset.getNumIndexes();

    if (num_dimensions == 1) {
        std::vector<int> weights(num_tensors, 0);
        weights.back() = 1;
        return weights;
    }

    std::vector<std::vector<int>> map;
    std::vector<std::vector<int>> lines1d;

    resortIndexes(mset, map, lines1d);

    Data2D<int> dag_down(num_dimensions, num_tensors);

    std::vector<int> weights(num_tensors, 0);

    // the row with contiguous indexes has a trivial solution
    auto const& last_jobs = lines1d[num_dimensions-1];
    for(int i=0; i<static_cast<int>(last_jobs.size() - 1); i++)
        weights[last_jobs[i+1] - 1] = 1;

    for(int d=num_dimensions-2; d>=0; d--) {
        #pragma omp parallel for
        for(int job = 0; job < static_cast<int>(lines1d[d].size() - 1); job++) {
            for(int i=lines1d[d][job+1]-2; i>=lines1d[d][job]; i--) {
                int &val = weights[map[d][i]];
                for(int j=i+1; j<lines1d[d][job+1]; j++) {
                    val -= weights[map[d][j]];
                }
            }
        }
    }

    return weights;
}